

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  ptls_sign_certificate_t *ppVar3;
  int iVar4;
  ptls_sign_certificate_t *ppVar5;
  size_t sVar6;
  
  ppVar3 = _self;
  do {
    ppVar5 = ppVar3;
    uVar2 = *(uint16_t *)&ppVar5[2].cb;
    if (uVar2 == 0xffff) {
      return 0x28;
    }
    sVar6 = 0;
    while (ppVar3 = ppVar5 + 2, num_algorithms != sVar6) {
      puVar1 = algorithms + sVar6;
      sVar6 = sVar6 + 1;
      if (*puVar1 == uVar2) {
        *selected_algorithm = uVar2;
        iVar4 = do_sign((EVP_PKEY *)_self[1].cb,outbuf,input,(EVP_MD *)ppVar5[3].cb);
        return iVar4;
      }
    }
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}